

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

bool COST_SENSITIVE::test_label(void *v)

{
  float *pfVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  label *ld;
  
  pfVar1 = *v;
  lVar3 = *(long *)((long)v + 8) - (long)pfVar1;
  if (lVar3 == 0) {
    return true;
  }
  if ((*pfVar1 != 3.4028235e+38) || (NAN(*pfVar1))) {
    bVar2 = false;
  }
  else {
    uVar4 = lVar3 >> 4;
    uVar5 = 1;
    while( true ) {
      uVar6 = (ulong)uVar5;
      bVar2 = uVar4 <= uVar6;
      if (uVar4 <= uVar6) break;
      uVar5 = uVar5 + 1;
      if (pfVar1[uVar6 * 4] != 3.4028235e+38) {
        return bVar2;
      }
      if (NAN(pfVar1[uVar6 * 4])) {
        return bVar2;
      }
    }
  }
  return bVar2;
}

Assistant:

inline size_t size() const { return _end - _begin; }